

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution2d.cpp
# Opt level: O3

int __thiscall embree::Distribution2D::init(Distribution2D *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  ulong uVar2;
  size_type in_RCX;
  size_t in_RDX;
  ulong uVar3;
  EVP_PKEY_CTX *pEVar4;
  ulong uVar5;
  vector<float,_std::allocator<float>_> fy;
  allocator_type local_49;
  vector<float,_std::allocator<float>_> local_48;
  
  this->width = in_RDX;
  this->height = in_RCX;
  std::vector<embree::Distribution1D,_std::allocator<embree::Distribution1D>_>::resize
            (&this->xDists,in_RCX);
  std::vector<float,_std::allocator<float>_>::vector(&local_48,this->height,&local_49);
  if (this->height != 0) {
    uVar5 = 0;
    pEVar4 = ctx;
    do {
      *(undefined4 *)
       ((long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start + uVar5 * 4) = 0;
      if (this->width == 0) {
        uVar3 = 0;
      }
      else {
        uVar2 = 0;
        do {
          *(float *)((long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start + uVar5 * 4) =
               *(float *)(pEVar4 + uVar2 * 4) +
               *(float *)((long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start + uVar5 * 4);
          uVar2 = uVar2 + 1;
          uVar3 = this->width;
        } while (uVar2 < uVar3);
      }
      Distribution1D::init
                ((this->xDists).
                 super__Vector_base<embree::Distribution1D,_std::allocator<embree::Distribution1D>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar5,ctx + uVar3 * uVar5 * 4);
      uVar5 = uVar5 + 1;
      pEVar4 = pEVar4 + in_RDX * 4;
    } while (uVar5 < this->height);
  }
  iVar1 = Distribution1D::init
                    (&this->yDist,
                     (EVP_PKEY_CTX *)
                     local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start);
  if ((EVP_PKEY_CTX *)
      local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (EVP_PKEY_CTX *)0x0) {
    operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
    iVar1 = extraout_EAX;
  }
  return iVar1;
}

Assistant:

void Distribution2D::init(const float* f, const size_t w, const size_t h)
  {
    /*! create arrays */
    width = w; height = h;
    xDists.resize(height);
    std::vector<float> fy(height);

    /*! compute y distribution and initialize row distributions */
    for (size_t y=0; y<height; y++)
    {
      /*! accumulate row to compute y distribution */
      fy[y] = 0.0f;
      for (size_t x=0; x<width; x++)
        fy[y] += f[y*w+x];

      /*! initialize distribution for current row */
      xDists[y].init(f+y*width, width);
    }

    /*! initializes the y distribution */
    yDist.init(fy.data(), height);
  }